

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_tostring.hpp
# Opt level: O1

string * __thiscall
Catch::Detail::
rangeToString<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>>
          (string *__return_storage_ptr__,Detail *this,
          __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> first,
          __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> last)

{
  char *pcVar1;
  Detail *pDVar2;
  ReusableStringStream rss;
  ReusableStringStream local_60;
  string local_50;
  
  ReusableStringStream::ReusableStringStream(&local_60);
  pcVar1 = "{ ";
  std::__ostream_insert<char,std::char_traits<char>>(local_60.m_oss,"{ ",2);
  if (this != (Detail *)first._M_current) {
    StringMaker<double,void>::convert_abi_cxx11_
              (&local_50,(StringMaker<double,void> *)pcVar1,*(double *)this);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_60.m_oss,local_50._M_dataplus._M_p,local_50._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    pDVar2 = this + 8;
    if (pDVar2 != (Detail *)first._M_current) {
      do {
        pcVar1 = ", ";
        std::__ostream_insert<char,std::char_traits<char>>(local_60.m_oss,", ",2);
        StringMaker<double,void>::convert_abi_cxx11_
                  (&local_50,(StringMaker<double,void> *)pcVar1,*(double *)pDVar2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_60.m_oss,local_50._M_dataplus._M_p,local_50._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        pDVar2 = pDVar2 + 8;
      } while (pDVar2 != (Detail *)first._M_current);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_60.m_oss," }",2);
  ReusableStringStream::str_abi_cxx11_(__return_storage_ptr__,&local_60);
  ReusableStringStream::~ReusableStringStream(&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::string rangeToString(InputIterator first, Sentinel last) {
            ReusableStringStream rss;
            rss << "{ ";
            if (first != last) {
                rss << ::Catch::Detail::stringify(*first);
                for (++first; first != last; ++first)
                    rss << ", " << ::Catch::Detail::stringify(*first);
            }
            rss << " }";
            return rss.str();
        }